

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternAddressMapper.cpp
# Opt level: O3

void __thiscall
PatternAddressMapper::randomize_addresses
          (PatternAddressMapper *this,FuzzingParameterSet *fuzzing_params,
          vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>
          *agg_access_patterns,bool verbose)

{
  unsigned_long *puVar1;
  pointer pcVar2;
  pointer pAVar3;
  pointer pAVar4;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *psVar5;
  void *pvVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  result_type_conflict1 rVar10;
  AggressorAccessPattern *acc_pattern;
  pointer pAVar11;
  pointer pAVar12;
  const_iterator cVar13;
  iterator iVar14;
  _Base_ptr p_Var15;
  undefined8 uVar16;
  undefined7 in_register_00000009;
  long lVar17;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *psVar18;
  unordered_map<int,_DRAMAddr,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DRAMAddr>_>_>
  *this_00;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *psVar19;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *psVar20;
  vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_> *__range1;
  ulong uVar21;
  unsigned_long uVar22;
  undefined1 auVar23 [8];
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  initializer_list<int> __l;
  undefined1 local_2850 [8];
  random_device device;
  mt19937 engine;
  discrete_distribution<int> dist;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> occupied_rows;
  undefined1 local_d8 [8];
  vector<int,_std::allocator<int>_> weights;
  _Base_ptr local_98;
  size_t row;
  size_type sStack_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Base_ptr local_70;
  FuzzingParameterSet *local_68;
  undefined1 local_60 [16];
  undefined1 auStack_50 [32];
  
  this_00 = &this->aggressor_to_addr;
  std::
  _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&this_00->_M_h);
  this->bank_no = bank_counter;
  uVar8 = bank_counter + 0x10;
  if (-1 < (int)(bank_counter + 1U)) {
    uVar8 = bank_counter + 1U;
  }
  bank_counter = (bank_counter - (uVar8 & 0xfffffff0)) + 1;
  auStack_50[0x1f] = FuzzingParameterSet::get_random_use_seq_addresses(fuzzing_params);
  local_68 = fuzzing_params;
  iVar7 = FuzzingParameterSet::get_random_start_row(fuzzing_params);
  if ((int)CONCAT71(in_register_00000009,verbose) != 0) {
    FuzzingParameterSet::print_dynamic_parameters(this->bank_no,(bool)auStack_50[0x1f],iVar7);
  }
  local_70 = (_Base_ptr)CONCAT44(local_70._4_4_,iVar7);
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&occupied_rows;
  occupied_rows._M_t._M_impl._0_4_ = 0;
  uVar22 = 0;
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  pAVar11 = (agg_access_patterns->
            super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pAVar3 = (agg_access_patterns->
           super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pAVar11 != pAVar3) {
    uVar22 = 0;
    do {
      uVar22 = uVar22 + ((long)(pAVar11->aggressors).
                               super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)(pAVar11->aggressors).
                               super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
                               super__Vector_impl_data._M_start >> 2);
      pAVar11 = pAVar11 + 1;
    } while (pAVar11 != pAVar3);
  }
  puVar1 = engine._M_x + 1;
  device.field_0._M_mt._M_p = (size_t)puVar1;
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&device.field_0 + 0x1380),
             "[PatternAddressMapper] Target no. of DRAM rows = %d","");
  iVar7 = FuzzingParameterSet::get_num_aggressors(local_68);
  format_string<int>((string *)local_2850,(string *)((long)&device.field_0 + 0x1380),iVar7);
  Logger::log_info((string *)local_2850,true);
  pcVar2 = (pointer)((long)&device.field_0 + 8);
  if (local_2850 != (undefined1  [8])pcVar2) {
    operator_delete((void *)local_2850,device.field_0._M_mt._M_x[1] + 1);
  }
  if ((unsigned_long *)device.field_0._M_mt._M_p != puVar1) {
    operator_delete((void *)device.field_0._M_mt._M_p,engine._M_x[1] + 1);
  }
  device.field_0._M_mt._M_p = (size_t)puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&device.field_0 + 0x1380),
             "[PatternAddressMapper] Aggressors in AggressorAccessPattern = %d","");
  format_string<unsigned_long>
            ((string *)local_2850,(string *)((long)&device.field_0 + 0x1380),uVar22);
  Logger::log_info((string *)local_2850,true);
  if (local_2850 != (undefined1  [8])pcVar2) {
    operator_delete((void *)local_2850,device.field_0._M_mt._M_x[1] + 1);
  }
  if ((unsigned_long *)device.field_0._M_mt._M_p != puVar1) {
    operator_delete((void *)device.field_0._M_mt._M_p,engine._M_x[1] + 1);
  }
  iVar7 = FuzzingParameterSet::get_num_aggressors(local_68);
  device.field_0._M_mt._M_p = (size_t)puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&device.field_0 + 0x1380),
             "[PatternAddressMapper] Probability to map multiple AAPs to same DRAM row = %d","");
  auVar26._8_4_ = (int)(uVar22 >> 0x20);
  auVar26._0_8_ = uVar22;
  auVar26._12_4_ = 0x45300000;
  dVar24 = (double)iVar7 /
           ((auVar26._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar22) - 4503599627370496.0));
  dVar25 = 1.0;
  if (dVar24 <= 1.0) {
    dVar25 = dVar24;
  }
  iVar7 = 100 - (int)(dVar25 * 100.0);
  format_string<int>((string *)local_2850,(string *)((long)&device.field_0 + 0x1380),iVar7);
  Logger::log_info((string *)local_2850,true);
  if (local_2850 != (undefined1  [8])pcVar2) {
    operator_delete((void *)local_2850,device.field_0._M_mt._M_x[1] + 1);
  }
  if ((unsigned_long *)device.field_0._M_mt._M_p != puVar1) {
    operator_delete((void *)device.field_0._M_mt._M_p,engine._M_x[1] + 1);
  }
  std::random_device::random_device((random_device *)local_2850);
  uVar8 = std::random_device::_M_getval();
  local_70 = (_Base_ptr)(long)(int)local_70;
  device.field_0._M_mt._M_p = (size_t)uVar8;
  lVar17 = 1;
  uVar21 = device.field_0._M_mt._M_p;
  do {
    uVar21 = (ulong)(((uint)(uVar21 >> 0x1e) ^ (uint)uVar21) * 0x6c078965 + (int)lVar17);
    engine._M_x[lVar17 + -1] = uVar21;
    lVar17 = lVar17 + 1;
  } while (lVar17 != 0x270);
  engine._M_x[0x26f] = 0x270;
  __l._M_len = 2;
  __l._M_array = (iterator)&engine._M_p;
  engine._M_p._0_4_ = (int)(dVar25 * 100.0);
  engine._M_p._4_4_ = iVar7;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_d8,__l,(allocator_type *)local_60);
  std::discrete_distribution<int>::param_type::
  param_type<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((param_type *)&engine._M_p,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_d8,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             weights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start);
  local_60._0_8_ = auStack_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_60,"[PatternAddressMapper] weights =","");
  Logger::log_info((string *)local_60,true);
  if ((_Base_ptr)local_60._0_8_ != (_Base_ptr)auStack_50) {
    operator_delete((void *)local_60._0_8_,auStack_50._0_8_ + 1);
  }
  if (local_d8 !=
      (undefined1  [8])
      weights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
     ) {
    auVar23 = local_d8;
    do {
      row = (size_t)&local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)&row,"%d","");
      format_string<int>((string *)local_60,(string *)&row,*(int *)auVar23);
      Logger::log_data((string *)local_60,true);
      if ((_Base_ptr)local_60._0_8_ != (_Base_ptr)auStack_50) {
        operator_delete((void *)local_60._0_8_,auStack_50._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)row != &local_80) {
        operator_delete((void *)row,(ulong)(local_80._M_allocated_capacity + 1));
      }
      auVar23 = (undefined1  [8])((long)auVar23 + 4);
    } while (auVar23 !=
             (undefined1  [8])
             weights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start);
  }
  pAVar11 = (agg_access_patterns->
            super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>).
            _M_impl.super__Vector_impl_data._M_start;
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)(agg_access_patterns->
               super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>).
               _M_impl.super__Vector_impl_data._M_finish;
  if (pAVar11 != (pointer)occupied_rows._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    weights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)&this->gen;
    do {
      pAVar12 = (pAVar11->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((pAVar11->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
          super__Vector_impl_data._M_finish != pAVar12) {
        uVar21 = 0;
        do {
          pAVar12 = pAVar12 + uVar21;
          cVar13 = std::
                   _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&this_00->_M_h,&pAVar12->id);
          if (cVar13.super__Node_iterator_base<std::pair<const_int,_DRAMAddr>,_false>._M_cur ==
              (__node_type *)0x0) {
            if (uVar21 == 0) {
              iVar7 = FuzzingParameterSet::get_agg_inter_distance(local_68);
              iVar9 = FuzzingParameterSet::get_max_row_no(local_68);
              local_70 = (_Base_ptr)
                         ((ulong)((long)&local_70->_M_color + (long)iVar7) % (ulong)(long)iVar9);
              rVar10 = std::discrete_distribution<int>::operator()
                                 ((discrete_distribution<int> *)&engine._M_p,
                                  (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                                   *)((long)&device.field_0 + 0x1380),(param_type *)&engine._M_p);
              if ((rVar10 == 0) ||
                 (occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_right ==
                  (_Base_ptr)0x0)) {
                iVar7 = 0;
                do {
                  if (auStack_50[0x1f] != '\0') {
                    local_98 = local_70;
                    goto LAB_0013bb2e;
                  }
                  iVar9 = FuzzingParameterSet::get_max_row_no(local_68);
                  local_60._8_8_ = (long)&local_70->_M_color + (long)iVar9;
                  local_60._0_8_ = local_70;
                  auStack_50._0_8_ = 1;
                  auStack_50._8_8_ = local_70;
                  auStack_50._16_8_ = local_60._8_8_;
                  uVar22 = Range<unsigned_long>::get_random_number
                                     ((Range<unsigned_long> *)local_60,
                                      (mt19937 *)
                                      weights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage);
                  iVar9 = FuzzingParameterSet::get_max_row_no(local_68);
                  local_98 = (_Base_ptr)(uVar22 % (ulong)(long)iVar9);
                  if (occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ == 0)
                  goto LAB_0013bb2e;
                  psVar5 = (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
                  psVar20 = &occupied_rows;
                  do {
                    psVar19 = psVar20;
                    psVar18 = psVar5;
                    p_Var15 = (psVar18->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
                    psVar20 = psVar18;
                    if (p_Var15 < local_98) {
                      psVar20 = psVar19;
                    }
                    psVar5 = (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                              *)(&(psVar18->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent)
                                [p_Var15 < local_98];
                  } while (psVar5 != (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                      *)0x0);
                  if (psVar20 == &occupied_rows) goto LAB_0013bb2e;
                  if (p_Var15 < local_98) {
                    psVar18 = psVar19;
                  }
                  if (local_98 < (psVar18->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right)
                  goto LAB_0013bb2e;
                  iVar7 = iVar7 + 1;
                } while (iVar7 != 7);
                row = (size_t)&local_80;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&row,
                           "Assigning unique addresses for Aggressor ID %d didn\'t succeed. Giving up after 3 trials."
                           ,"");
                format_string<int>((string *)local_60,(string *)&row,pAVar12->id);
                Logger::log_info((string *)local_60,true);
                if ((_Base_ptr)local_60._0_8_ != (_Base_ptr)auStack_50) {
                  operator_delete((void *)local_60._0_8_,auStack_50._0_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)row != &local_80) {
                  operator_delete((void *)row,(ulong)(local_80._M_allocated_capacity + 1));
                }
              }
              else {
                local_60._0_8_ = &DAT_00000001;
                local_60._8_8_ = occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                ;
                auStack_50._0_8_ = 1;
                auStack_50._8_8_ = &DAT_00000001;
                auStack_50._16_8_ =
                     occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
                uVar22 = Range<unsigned_long>::get_random_number
                                   ((Range<unsigned_long> *)local_60,
                                    (mt19937 *)
                                    weights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage);
                p_Var15 = occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                while (uVar22 = uVar22 - 1, uVar22 != 0) {
                  p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
                }
                local_98 = *(_Base_ptr *)(p_Var15 + 1);
              }
            }
            else {
              pAVar4 = (pAVar11->aggressors).
                       super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((ulong)((long)(pAVar11->aggressors).
                                super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pAVar4 >> 2) <= uVar21 - 1
                 ) goto LAB_0013bf1c;
              iVar14 = std::
                       _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find(&this_00->_M_h,&pAVar4[uVar21 - 1].id);
              if (iVar14.super__Node_iterator_base<std::pair<const_int,_DRAMAddr>,_false>._M_cur ==
                  (__node_type *)0x0) goto LAB_0013bf10;
              lVar17 = *(long *)((long)iVar14.
                                       super__Node_iterator_base<std::pair<const_int,_DRAMAddr>,_false>
                                       ._M_cur + 0x18);
              iVar7 = FuzzingParameterSet::get_agg_intra_distance(local_68);
              iVar9 = FuzzingParameterSet::get_max_row_no(local_68);
              local_98 = (_Base_ptr)((ulong)(lVar17 + iVar7) % (ulong)(long)iVar9);
              local_70 = local_98;
            }
          }
          else {
            iVar14 = std::
                     _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find(&this_00->_M_h,&pAVar12->id);
            if (iVar14.super__Node_iterator_base<std::pair<const_int,_DRAMAddr>,_false>._M_cur ==
                (__node_type *)0x0) {
              std::__throw_out_of_range("_Map_base::at");
LAB_0013bf10:
              std::__throw_out_of_range("_Map_base::at");
LAB_0013bf1c:
              uVar16 = std::__throw_out_of_range_fmt
                                 (
                                 "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 );
              if ((_Base_ptr)local_60._0_8_ != (_Base_ptr)auStack_50) {
                operator_delete((void *)local_60._0_8_,auStack_50._0_8_ + 1);
              }
              if ((pointer)row != pAVar12) {
                operator_delete((void *)row,(ulong)(local_80._M_allocated_capacity + 1));
              }
              std::discrete_distribution<int>::~discrete_distribution
                        ((discrete_distribution<int> *)&engine._M_p);
              if (local_d8 != (undefined1  [8])0x0) {
                operator_delete((void *)local_d8,
                                (long)weights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)local_d8);
              }
              std::random_device::_M_fini();
              std::
              _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
              ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)&dist._M_param._M_cp.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
              _Unwind_Resume(uVar16);
            }
            local_98 = *(_Base_ptr *)
                        ((long)iVar14.
                               super__Node_iterator_base<std::pair<const_int,_DRAMAddr>,_false>.
                               _M_cur + 0x18);
          }
LAB_0013bb2e:
          std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::_M_insert_unique<unsigned_long_const&>
                    ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      *)&dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (unsigned_long *)&local_98);
          DRAMAddr::DRAMAddr((DRAMAddr *)&row,(long)this->bank_no,(size_t)local_98,0);
          local_60._0_4_ = pAVar12->id;
          auStack_50._8_8_ = local_80._M_allocated_capacity;
          local_60._8_8_ = row;
          auStack_50._0_8_ = sStack_88;
          std::
          _Hashtable<int,std::pair<int_const,DRAMAddr>,std::allocator<std::pair<int_const,DRAMAddr>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<int,DRAMAddr>>
                    ((_Hashtable<int,std::pair<int_const,DRAMAddr>,std::allocator<std::pair<int_const,DRAMAddr>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)this_00,local_60);
          uVar21 = uVar21 + 1;
          pAVar12 = (pAVar11->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar21 < (ulong)((long)(pAVar11->aggressors).
                                        super__Vector_base<Aggressor,_std::allocator<Aggressor>_>.
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pAVar12 >>
                                 2));
      }
      pAVar11 = pAVar11 + 1;
    } while (pAVar11 != (pointer)occupied_rows._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  determine_victims(this,agg_access_patterns);
  this->min_row =
       *(size_t *)(occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent + 1);
  lVar17 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&occupied_rows);
  this->max_row = *(size_t *)(lVar17 + 0x20);
  if (verbose) {
    row = (size_t)&local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&row,"Found %d different aggressors (IDs) in pattern.","");
    format_string<unsigned_long>
              ((string *)local_60,(string *)&row,(this->aggressor_to_addr)._M_h._M_element_count);
    Logger::log_info((string *)local_60,true);
    if ((_Base_ptr)local_60._0_8_ != (_Base_ptr)auStack_50) {
      operator_delete((void *)local_60._0_8_,auStack_50._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)row != &local_80) {
      operator_delete((void *)row,(ulong)(local_80._M_allocated_capacity + 1));
    }
  }
  if (dist._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(dist._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                    (long)dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)dist._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  pvVar6 = (void *)CONCAT44(engine._M_p._4_4_,(int)engine._M_p);
  if (pvVar6 != (void *)0x0) {
    operator_delete(pvVar6,(long)dist._M_param._M_prob.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pvVar6);
  }
  if (local_d8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_d8,
                    (long)weights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_d8);
  }
  std::random_device::_M_fini();
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
               *)&dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void PatternAddressMapper::randomize_addresses(FuzzingParameterSet &fuzzing_params,
                                               const std::vector<AggressorAccessPattern> &agg_access_patterns,
                                               bool verbose) {
  // clear any already existing mapping
  aggressor_to_addr.clear();

  // retrieve and then store randomized values as they should be the same for all added addresses
  // (store bank_no as field for get_random_nonaccessed_rows)
  bank_no = PatternAddressMapper::bank_counter;
  PatternAddressMapper::bank_counter = (PatternAddressMapper::bank_counter + 1) % NUM_BANKS;
  const bool use_seq_addresses = fuzzing_params.get_random_use_seq_addresses();
  const int start_row = fuzzing_params.get_random_start_row();
  if (verbose) FuzzingParameterSet::print_dynamic_parameters(bank_no, use_seq_addresses, start_row);

  auto cur_row = static_cast<size_t>(start_row);

  // a set of DRAM rows that are already assigned to aggressors
  std::set<size_t> occupied_rows;

  // we can make use here of the fact that each aggressor (identified by its ID) has a fixed N, that means, is
  // either accessed individually (N=1) or in a group of multiple aggressors (N>1; e.g., N=2 for double sided)
  // => if we already know the address of any aggressor in an aggressor access pattern, we already must know
  // addresses for all of them as we must have accessed all of them together before
  size_t row;
  int assignment_trial_cnt = 0;

  size_t total_abstract_aggs = 0;
  for (auto &acc_pattern : agg_access_patterns) total_abstract_aggs += acc_pattern.aggressors.size();
  Logger::log_info(format_string("[PatternAddressMapper] Target no. of DRAM rows = %d",
      fuzzing_params.get_num_aggressors()));
  Logger::log_info(format_string("[PatternAddressMapper] Aggressors in AggressorAccessPattern = %d",
      total_abstract_aggs));

  // probability to map aggressor to same row as another aggressor is already mapped to
  const int prob2 = 100 - (
      static_cast<int>(
          std::min(static_cast<double>(fuzzing_params.get_num_aggressors())/static_cast<double>(total_abstract_aggs),1.0)*100));
  Logger::log_info(format_string("[PatternAddressMapper] Probability to map multiple AAPs to same DRAM row = %d", prob2));

  std::random_device device;
  std::mt19937 engine(device()); // Seed the random number engine
  std::vector<int> weights = std::vector<int>({100-prob2, prob2});
  std::discrete_distribution<> dist(weights.begin(), weights.end()); // Create the distribution

  Logger::log_info("[PatternAddressMapper] weights =");
  for (const auto &w : weights) {
    Logger::log_data(format_string("%d", w));
  }

//  Logger::log_info("Generating 1k random numbers to see how well distribution works ");
//  size_t cnt_0 = 0;
//  size_t cnt_1 = 0;
//  for (size_t i = 0; i < 1000; ++i) {
//    if (dist(engine) == 0)
//      cnt_0++;
//    else
//      cnt_1++;
//  }
//  Logger::log_info(format_string("cnt_0 = %lu", cnt_0));
//  Logger::log_info(format_string("cnt_1 = %lu", cnt_1));

  for (auto &acc_pattern : agg_access_patterns) {
    for (size_t i = 0; i < acc_pattern.aggressors.size(); i++) {
      const Aggressor &current_agg = acc_pattern.aggressors.at(i);

      // aggressor has existing row mapping OR
      if (aggressor_to_addr.count(current_agg.id) > 0) {
        row = aggressor_to_addr.at(current_agg.id).row;
      } else if (i > 0) {  // aggressor is part of a n>1 aggressor tuple
        // we need to add the appropriate distance and cannot choose randomly
        auto last_addr = aggressor_to_addr.at(acc_pattern.aggressors.at(i - 1).id);
        // update cur_row for its next use (note that here it is: cur_row = last_addr.row)
        cur_row = (last_addr.row + (size_t) fuzzing_params.get_agg_intra_distance())%fuzzing_params.get_max_row_no();
        row = cur_row;
      } else {
        // this is a new aggressor pair - we can choose where to place it
        // if use_seq_addresses is true, we use the last address and add the agg_inter_distance on top -> this is the
        //   row of the next aggressor
        // if use_seq_addresses is false, we just pick any random row no. between [0, 8192]
        cur_row = (cur_row + (size_t) fuzzing_params.get_agg_inter_distance())%fuzzing_params.get_max_row_no();

        bool map_to_existing_agg = dist(engine);
        if (map_to_existing_agg && !occupied_rows.empty()) {
            auto idx = Range<size_t>(1, occupied_rows.size()).get_random_number(gen)-1;
            auto it = occupied_rows.begin();
            while (idx--) it++;
            row = *it;
        } else {
        retry:
          row = use_seq_addresses ?
                cur_row :
                (Range<size_t>(cur_row, cur_row + fuzzing_params.get_max_row_no()).get_random_number(gen)
                    %fuzzing_params.get_max_row_no());

          // check that we haven't assigned this address yet to another aggressor ID
          // if use_seq_addresses is True, the only way that the address is already assigned is that we already flipped
          // around the address range once (because of the modulo operator) so that retrying doesn't make sense
          if (!use_seq_addresses && occupied_rows.count(row) > 0) {
            assignment_trial_cnt++;
            if (assignment_trial_cnt < 7) goto retry;
            Logger::log_info(format_string(
                "Assigning unique addresses for Aggressor ID %d didn't succeed. Giving up after 3 trials.",
                current_agg.id));
          }
        }
      }

      assignment_trial_cnt = 0;
      occupied_rows.insert(row);
      aggressor_to_addr.insert(std::make_pair(current_agg.id, DRAMAddr(static_cast<size_t>(bank_no), row, 0)));
    }
  }

  // determine victim rows
  determine_victims(agg_access_patterns);

  // this works as sets are always ordered
  min_row = *occupied_rows.begin();
  max_row = *occupied_rows.rbegin();

  if (verbose)
    Logger::log_info(format_string("Found %d different aggressors (IDs) in pattern.", aggressor_to_addr.size()));
}